

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_applies_must(lyd_node *node)

{
  LYS_NODE LVar1;
  lys_node *node_00;
  int iVar2;
  int iVar3;
  long lStack_20;
  
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x174f,"int resolve_applies_must(const struct lyd_node *)");
  }
  node_00 = node->schema;
  LVar1 = node_00->nodetype;
  if (LVar1 == LYS_CONTAINER) {
    lStack_20 = 0x1e;
LAB_001168d3:
    if (node_00->padding[lStack_20 + -0x1c] != '\0') {
      iVar2 = 1;
      goto LAB_001168e1;
    }
  }
  else {
    if ((LVar1 == LYS_ANYDATA) || (LVar1 == LYS_LEAFLIST)) {
LAB_001168d1:
      lStack_20 = 0x1f;
      goto LAB_001168d3;
    }
    if (LVar1 == LYS_LIST) {
      lStack_20 = 0x1c;
      goto LAB_001168d3;
    }
    if (((LVar1 == LYS_ANYXML) || (LVar1 == LYS_NOTIF)) || (LVar1 == LYS_LEAF)) goto LAB_001168d1;
  }
  iVar2 = 0;
LAB_001168e1:
  iVar3 = iVar2;
  if (node->prev->next == (lyd_node *)0x0) {
    do {
      node_00 = lys_parent(node_00);
      if (node_00 == (lys_node *)0x0) {
        return iVar2;
      }
    } while ((node_00->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN);
    iVar3 = iVar2 + 2;
    if ((node_00->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
      iVar3 = iVar2;
    }
  }
  return iVar3;
}

Assistant:

int
resolve_applies_must(const struct lyd_node *node)
{
    int ret = 0;
    uint8_t must_size;
    struct lys_node *schema, *iter;

    assert(node);

    schema = node->schema;

    /* their own must */
    switch (schema->nodetype) {
    case LYS_CONTAINER:
        must_size = ((struct lys_node_container *)schema)->must_size;
        break;
    case LYS_LEAF:
        must_size = ((struct lys_node_leaf *)schema)->must_size;
        break;
    case LYS_LEAFLIST:
        must_size = ((struct lys_node_leaflist *)schema)->must_size;
        break;
    case LYS_LIST:
        must_size = ((struct lys_node_list *)schema)->must_size;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        must_size = ((struct lys_node_anydata *)schema)->must_size;
        break;
    case LYS_NOTIF:
        must_size = ((struct lys_node_notif *)schema)->must_size;
        break;
    default:
        must_size = 0;
        break;
    }

    if (must_size) {
        ++ret;
    }

    /* schema may be a direct data child of input/output with must (but it must be first, it needs to be evaluated only once) */
    if (!node->prev->next) {
        for (iter = lys_parent(schema); iter && (iter->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES)); iter = lys_parent(iter));
        if (iter && (iter->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
            ret += 0x2;
        }
    }

    return ret;
}